

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list.hpp
# Opt level: O0

void __thiscall
pstore::broker::intrusive_list<(anonymous_namespace)::value>::intrusive_list
          (intrusive_list<(anonymous_namespace)::value> *this)

{
  value *pvVar1;
  pointer pvVar2;
  pointer pvVar3;
  list_member<(anonymous_namespace)::value> *plVar4;
  intrusive_list<(anonymous_namespace)::value> *this_local;
  
  pvVar1 = (value *)operator_new(0x18);
  anon_unknown.dwarf_647ac::value::value(pvVar1);
  std::unique_ptr<(anonymous_namespace)::value,std::default_delete<(anonymous_namespace)::value>>::
  unique_ptr<std::default_delete<(anonymous_namespace)::value>,void>
            ((unique_ptr<(anonymous_namespace)::value,std::default_delete<(anonymous_namespace)::value>>
              *)this,pvVar1);
  pvVar1 = (value *)operator_new(0x18);
  anon_unknown.dwarf_647ac::value::value(pvVar1);
  std::unique_ptr<(anonymous_namespace)::value,std::default_delete<(anonymous_namespace)::value>>::
  unique_ptr<std::default_delete<(anonymous_namespace)::value>,void>
            ((unique_ptr<(anonymous_namespace)::value,std::default_delete<(anonymous_namespace)::value>>
              *)&this->tail_,pvVar1);
  pvVar2 = std::
           unique_ptr<(anonymous_namespace)::value,_std::default_delete<(anonymous_namespace)::value>_>
           ::get(&this->tail_);
  pvVar3 = std::
           unique_ptr<(anonymous_namespace)::value,_std::default_delete<(anonymous_namespace)::value>_>
           ::operator->(&this->head_);
  plVar4 = anon_unknown.dwarf_647ac::value::get_list_member(pvVar3);
  plVar4->next = pvVar2;
  pvVar2 = std::
           unique_ptr<(anonymous_namespace)::value,_std::default_delete<(anonymous_namespace)::value>_>
           ::get(&this->head_);
  pvVar3 = std::
           unique_ptr<(anonymous_namespace)::value,_std::default_delete<(anonymous_namespace)::value>_>
           ::operator->(&this->tail_);
  plVar4 = anon_unknown.dwarf_647ac::value::get_list_member(pvVar3);
  plVar4->prev = pvVar2;
  return;
}

Assistant:

intrusive_list<T>::intrusive_list ()
                : head_{std::unique_ptr<T> (new T)}
                , tail_{std::unique_ptr<T> (new T)} {
            head_->get_list_member ().next = tail_.get ();
            tail_->get_list_member ().prev = head_.get ();
        }